

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constructor.cpp
# Opt level: O0

void __thiscall
cppgenerate::Constructor::printImplementation
          (Constructor *this,Class *parent,ostream *stream,bool inHeader)

{
  bool bVar1;
  reference other;
  size_type sVar2;
  reference pPVar3;
  long lVar4;
  reference other_00;
  ostream *poVar5;
  undefined1 local_280 [32];
  undefined1 local_260 [40];
  MemberVariable memberVar_1;
  iterator __end1_2;
  iterator __begin1_2;
  vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_> *__range1_2;
  Parent clparent;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_> *__range1_1;
  undefined1 local_118 [8];
  MemberVariable memberVar;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_> *__range1;
  undefined1 local_60 [40];
  vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>
  initializerVariables;
  bool comma;
  bool inHeader_local;
  ostream *stream_local;
  Class *parent_local;
  Constructor *this_local;
  
  initializerVariables.
  super__Vector_base<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  initializerVariables.
  super__Vector_base<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = inHeader;
  std::vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>::vector
            ((vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_> *)
             (local_60 + 0x20));
  Class::getName_abi_cxx11_((Class *)local_60);
  printConstructorSignature
            (this,stream,(string *)local_60,
             (bool)(~initializerVariables.
                     super__Vector_base<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
  std::__cxx11::string::~string((string *)local_60);
  __end1 = std::vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>::
           begin(&parent->m_memberVariables);
  memberVar._136_8_ =
       std::vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>::end
                 (&parent->m_memberVariables);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_cppgenerate::MemberVariable_*,_std::vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>_>
                                *)&memberVar.field_0x88);
    if (!bVar1) break;
    other = __gnu_cxx::
            __normal_iterator<const_cppgenerate::MemberVariable_*,_std::vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>_>
            ::operator*(&__end1);
    MemberVariable::MemberVariable((MemberVariable *)local_118,other);
    Variable::initializer_abi_cxx11_((Variable *)&__range1_1);
    lVar4 = std::__cxx11::string::size();
    std::__cxx11::string::~string((string *)&__range1_1);
    if (lVar4 != 0) {
      std::vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>::
      push_back((vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_> *
                )(local_60 + 0x20),(value_type *)local_118);
    }
    MemberVariable::~MemberVariable((MemberVariable *)local_118);
    __gnu_cxx::
    __normal_iterator<const_cppgenerate::MemberVariable_*,_std::vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>_>
    ::operator++(&__end1);
  }
  sVar2 = std::vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>::
          size((vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_> *)
               (local_60 + 0x20));
  if (sVar2 == 0) {
    sVar2 = std::vector<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>::
            size(&parent->m_parents);
    if (sVar2 == 0) goto LAB_0013c055;
  }
  std::operator<<(stream," : ");
LAB_0013c055:
  __end1_1 = std::vector<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>::
             begin(&parent->m_parents);
  clparent._64_8_ =
       std::vector<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>::end
                 (&parent->m_parents);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<const_cppgenerate::Class::Parent_*,_std::vector<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>_>
                        *)&clparent.field_0x40);
    if (!bVar1) break;
    pPVar3 = __gnu_cxx::
             __normal_iterator<const_cppgenerate::Class::Parent_*,_std::vector<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>_>
             ::operator*(&__end1_1);
    Class::Parent::Parent((Parent *)&__range1_2,pPVar3);
    if ((initializerVariables.
         super__Vector_base<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
      poVar5 = std::operator<<(stream,",");
      std::ostream::operator<<((ostream *)poVar5,std::endl<char,std::char_traits<char>>);
    }
    poVar5 = std::operator<<(stream,(string *)&__range1_2);
    std::operator<<(poVar5,"( ");
    lVar4 = std::__cxx11::string::size();
    if (lVar4 != 0) {
      std::operator<<(stream,(string *)&clparent.inheritanceType);
    }
    std::operator<<(stream," )");
    initializerVariables.
    super__Vector_base<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    Class::Parent::~Parent((Parent *)&__range1_2);
    __gnu_cxx::
    __normal_iterator<const_cppgenerate::Class::Parent_*,_std::vector<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>_>
    ::operator++(&__end1_1);
  }
  __end1_2 = std::vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>
             ::begin((vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>
                      *)(local_60 + 0x20));
  memberVar_1._136_8_ =
       std::vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>::end
                 ((vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>
                   *)(local_60 + 0x20));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_2,
                       (__normal_iterator<cppgenerate::MemberVariable_*,_std::vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>_>
                        *)&memberVar_1.field_0x88);
    if (!bVar1) break;
    other_00 = __gnu_cxx::
               __normal_iterator<cppgenerate::MemberVariable_*,_std::vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>_>
               ::operator*(&__end1_2);
    MemberVariable::MemberVariable((MemberVariable *)(local_260 + 0x20),other_00);
    if ((initializerVariables.
         super__Vector_base<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
      std::operator<<(stream,", ");
    }
    Variable::name_abi_cxx11_((Variable *)local_260);
    poVar5 = std::operator<<(stream,(string *)local_260);
    poVar5 = std::operator<<(poVar5,"( ");
    Variable::initializer_abi_cxx11_((Variable *)local_280);
    poVar5 = std::operator<<(poVar5,(string *)local_280);
    poVar5 = std::operator<<(poVar5," )");
    std::ostream::operator<<((ostream *)poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_280);
    std::__cxx11::string::~string((string *)local_260);
    initializerVariables.
    super__Vector_base<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    MemberVariable::~MemberVariable((MemberVariable *)(local_260 + 0x20));
    __gnu_cxx::
    __normal_iterator<cppgenerate::MemberVariable_*,_std::vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>_>
    ::operator++(&__end1_2);
  }
  poVar5 = std::operator<<(stream,"{");
  std::ostream::operator<<((ostream *)poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = operator<<(stream,&this->m_code);
  std::ostream::operator<<((ostream *)poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(stream,"}");
  std::ostream::operator<<((ostream *)poVar5,std::endl<char,std::char_traits<char>>);
  std::vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>::~vector
            ((vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_> *)
             (local_60 + 0x20));
  return;
}

Assistant:

void Constructor::printImplementation( const cppgenerate::Class* parent, std::ostream& stream, bool inHeader ) const{
    bool comma = false;
    std::vector<cppgenerate::MemberVariable> initializerVariables;

    printConstructorSignature( stream, parent->getName(), !inHeader );

    for( cppgenerate::MemberVariable memberVar : parent->m_memberVariables ){
        if( memberVar.initializer().size() ){
            initializerVariables.push_back( memberVar );
        }
    }

    if( initializerVariables.size() || parent->m_parents.size() ) stream << " : ";

    for( cppgenerate::Class::Parent clparent : parent->m_parents ){
        if( comma ) stream << "," << std::endl;
        stream << clparent.parentName << "( ";
        if( clparent.initializer.size() ) stream << clparent.initializer;
        stream << " )";
        comma = true;
    }


    for( cppgenerate::MemberVariable memberVar : initializerVariables ){
        if( comma ) stream << ", ";
        stream << memberVar.name() << "( " << memberVar.initializer() << " )" << std::endl;
        comma = true;
    }

    stream << "{" << std::endl;

    stream << m_code << std::endl;
    stream << "}" << std::endl;
}